

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::NeuralNetworkRegressor::NeuralNetworkRegressor
          (NeuralNetworkRegressor *this,NeuralNetworkRegressor *from)

{
  void *pvVar1;
  NetworkUpdateParameters *from_00;
  int iVar2;
  NetworkUpdateParameters *this_00;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__NeuralNetworkRegressor_00705a28;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->layers_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->layers_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->layers_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->layers_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
            (&(this->layers_).super_RepeatedPtrFieldBase,&(from->layers_).super_RepeatedPtrFieldBase
            );
  (this->preprocessing_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->preprocessing_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->preprocessing_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->preprocessing_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkPreprocessing>::TypeHandler>
            (&(this->preprocessing_).super_RepeatedPtrFieldBase,
             &(from->preprocessing_).super_RepeatedPtrFieldBase);
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  from_00 = from->updateparams_;
  if (from_00 == (NetworkUpdateParameters *)0x0 ||
      from == (NeuralNetworkRegressor *)&_NeuralNetworkRegressor_default_instance_) {
    this_00 = (NetworkUpdateParameters *)0x0;
  }
  else {
    this_00 = (NetworkUpdateParameters *)operator_new(0x50);
    NetworkUpdateParameters::NetworkUpdateParameters(this_00,from_00);
  }
  this->updateparams_ = this_00;
  iVar2 = from->imageinputshapemapping_;
  this->arrayinputshapemapping_ = from->arrayinputshapemapping_;
  this->imageinputshapemapping_ = iVar2;
  return;
}

Assistant:

NeuralNetworkRegressor::NeuralNetworkRegressor(const NeuralNetworkRegressor& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      layers_(from.layers_),
      preprocessing_(from.preprocessing_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_updateparams()) {
    updateparams_ = new ::CoreML::Specification::NetworkUpdateParameters(*from.updateparams_);
  } else {
    updateparams_ = NULL;
  }
  ::memcpy(&arrayinputshapemapping_, &from.arrayinputshapemapping_,
    reinterpret_cast<char*>(&imageinputshapemapping_) -
    reinterpret_cast<char*>(&arrayinputshapemapping_) + sizeof(imageinputshapemapping_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.NeuralNetworkRegressor)
}